

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

bool Fixpp::impl::
     DictionaryVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,meta::map::Map<>>
     ::
     visit<Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)49>,Fixpp::Required<Fixpp::TagT<112u,Fixpp::Type::String>>>,Fixpp::TypedParsingContext<void>,Fixpp::impl::MessageVisitor<AssertVisitor,AssertVisitRules>>
               (TypedParsingContext<void> *context,
               MessageVisitor<AssertVisitor,_AssertVisitRules> *visitor)

{
  bool bVar1;
  unsigned_long msgTypeSize;
  char *msgType;
  MessageVisitor<AssertVisitor,_AssertVisitRules> *visitor_local;
  TypedParsingContext<void> *context_local;
  
  bVar1 = Chars<'1'>::equals((context->super_ParsingContext).msgType.first,
                             (context->super_ParsingContext).msgType.second);
  if (bVar1) {
    MessageVisitor<AssertVisitor,AssertVisitRules>::operator()
              ((MessageVisitor<AssertVisitor,AssertVisitRules> *)visitor);
  }
  return bVar1;
}

Assistant:

static bool visit(const Context& context, Visitor& visitor)
            {
                auto msgType = context.msgType.first;
                auto msgTypeSize = context.msgType.second;
                if (Message::MsgType::equals(msgType, msgTypeSize))
                {
                    visitor(id<Header> { }, id<OverrideFor<Message, Overrides>> {});
                    return true;
                }

                return false;
            }